

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_sqrt_impl(ggml_context *ctx,ggml_tensor *a,_Bool inplace)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined7 in_register_00000011;
  void *data;
  bool bVar3;
  
  if ((int)CONCAT71(in_register_00000011,inplace) == 0) {
    bVar3 = a->grad != (ggml_tensor *)0x0;
  }
  else {
    bVar3 = false;
  }
  if (inplace) {
    data = a->data;
  }
  else {
    data = (void *)0x0;
  }
  pgVar1 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,data);
  pgVar1->op = GGML_OP_SQRT;
  if (bVar3) {
    pgVar2 = ggml_new_tensor_impl(ctx,pgVar1->type,pgVar1->n_dims,pgVar1->ne,(void *)0x0);
  }
  else {
    pgVar2 = (ggml_tensor *)0x0;
  }
  pgVar1->grad = pgVar2;
  pgVar1->src0 = a;
  pgVar1->src1 = (ggml_tensor *)0x0;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_sqrt_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        bool inplace) {
    bool is_node = false;

    if (!inplace && (a->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_SQRT;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}